

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O3

pool_ptr<soul::AST::ProcessorInstance> __thiscall
soul::AST::Connection::getProcessorInstance(Connection *this,Expression *e)

{
  long lVar1;
  _func_int **pp_Var2;
  
  lVar1 = __dynamic_cast(e,&Expression::typeinfo,&ProcessorInstanceRef::typeinfo,0);
  if (lVar1 == 0) {
    pp_Var2 = (_func_int **)0x0;
    do {
      lVar1 = __dynamic_cast(e,&Expression::typeinfo,&ConnectionEndpointRef::typeinfo,0);
      if (lVar1 == 0) {
        lVar1 = __dynamic_cast(e,&Expression::typeinfo,&ArrayElementRef::typeinfo,0);
        if (lVar1 == 0) {
          lVar1 = __dynamic_cast(e,&Expression::typeinfo,&DotOperator::typeinfo,0);
          if (lVar1 == 0) goto LAB_002037b6;
          e = *(Expression **)(lVar1 + 0x30);
        }
        else {
          e = *(Expression **)(lVar1 + 0x30);
          if (e == (Expression *)0x0) {
            throwInternalCompilerError("object != nullptr","operator*",0x3b);
          }
        }
      }
      else {
        e = *(Expression **)(lVar1 + 0x30);
        if (e == (Expression *)0x0) goto LAB_002037b6;
      }
      lVar1 = __dynamic_cast(e,&Expression::typeinfo,&ProcessorInstanceRef::typeinfo,0);
    } while (lVar1 == 0);
  }
  pp_Var2 = *(_func_int ***)(lVar1 + 0x30);
LAB_002037b6:
  (this->super_ASTObject)._vptr_ASTObject = pp_Var2;
  return (pool_ptr<soul::AST::ProcessorInstance>)(ProcessorInstance *)this;
}

Assistant:

static pool_ptr<ProcessorInstance> getProcessorInstance (Expression& e)
        {
            if (auto pr = cast<ProcessorInstanceRef> (e))    return pr->processorInstance;
            if (auto er = cast<ConnectionEndpointRef> (e))   return er->parentProcessorInstance != nullptr ? getProcessorInstance (*er->parentProcessorInstance) : nullptr;
            if (auto ar = cast<ArrayElementRef> (e))         return getProcessorInstance (*ar->object);
            if (auto dot = cast<DotOperator> (e))            return getProcessorInstance (dot->lhs);

            return {};
        }